

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O3

void __thiscall
CServerBrowser::SetFavoritePassword(CServerBrowser *this,char *pAddress,char *pPassword)

{
  bool bVar1;
  int iVar2;
  CServerEntry *pCVar3;
  uint ServerlistType;
  bool bVar4;
  long in_FS_OFFSET;
  NETADDR Addr;
  NETADDR local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CServerBrowserFavorites::AddFavoriteEx
                    (&this->m_ServerBrowserFavorites,pAddress,(NETADDR *)0x0,false,pPassword);
  if (bVar1) {
    local_58.type = 0;
    local_58.ip[0] = '\0';
    local_58.ip[1] = '\0';
    local_58.ip[2] = '\0';
    local_58.ip[3] = '\0';
    local_58.ip[4] = '\0';
    local_58.ip[5] = '\0';
    local_58.ip[6] = '\0';
    local_58.ip[7] = '\0';
    local_58.ip[8] = '\0';
    local_58.ip[9] = '\0';
    local_58.ip[10] = '\0';
    local_58.ip[0xb] = '\0';
    local_58.ip[0xc] = '\0';
    local_58.ip[0xd] = '\0';
    local_58.ip[0xe] = '\0';
    local_58.ip[0xf] = '\0';
    local_58.port = 0;
    local_58.reserved = 0;
    iVar2 = net_addr_from_str(&local_58,pAddress);
    if (iVar2 == 0) {
      ServerlistType = 0;
      bVar1 = true;
      do {
        bVar4 = bVar1;
        pCVar3 = Find(this,ServerlistType,&local_58);
        if ((pCVar3 != (CServerEntry *)0x0) &&
           ((pCVar3->m_Info).m_Favorite = true, ServerlistType == this->m_ActServerlistType)) {
          CServerBrowserFilter::Sort
                    (&this->m_ServerBrowserFilter,this->m_aServerlist[ServerlistType].m_ppServerlist
                     ,this->m_aServerlist[ServerlistType].m_NumServers,2);
        }
        ServerlistType = 1;
        bVar1 = false;
      } while (bVar4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServerBrowser::SetFavoritePassword(const char *pAddress, const char *pPassword)
{
	if(m_ServerBrowserFavorites.AddFavoriteEx(pAddress, 0, false, pPassword))
	{
		NETADDR Addr = {0};
		if(net_addr_from_str(&Addr, pAddress))
			return;
		for(int i = 0; i < NUM_TYPES; ++i)
		{
			CServerEntry *pEntry = Find(i, Addr);
			if(pEntry)
			{
				pEntry->m_Info.m_Favorite = true;

				// refresh servers in all filters where favorites are filtered
				if(i == m_ActServerlistType)
					m_ServerBrowserFilter.Sort(m_aServerlist[m_ActServerlistType].m_ppServerlist, m_aServerlist[m_ActServerlistType].m_NumServers, CServerBrowserFilter::RESORT_FLAG_FAV);
			}
		}
	}
}